

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runxmlconf.c
# Opt level: O0

int xmlconfTest(void)

{
  int iVar1;
  xmlDocPtr doc_00;
  xmlNodePtr cur_00;
  int local_2c;
  int ret;
  xmlNodePtr cur;
  xmlDocPtr doc;
  char *confxml;
  
  iVar1 = checkTestFile("xmlconf/xmlconf.xml");
  if (iVar1 == 0) {
    fprintf(_stderr,"%s is missing \n","xmlconf/xmlconf.xml");
    xmlconfInfo();
    return -1;
  }
  doc_00 = (xmlDocPtr)xmlReadFile("xmlconf/xmlconf.xml",0,2);
  if (doc_00 != (xmlDocPtr)0x0) {
    cur_00 = (xmlNodePtr)xmlDocGetRootElement(doc_00);
    if ((cur_00 == (xmlNodePtr)0x0) || (iVar1 = xmlStrEqual(cur_00->name,"TESTSUITE"), iVar1 == 0))
    {
      fprintf(_stderr,"Unexpected format %s\n","xmlconf/xmlconf.xml");
      xmlconfInfo();
      local_2c = -1;
    }
    else {
      local_2c = xmlconfTestSuite(doc_00,cur_00);
    }
    xmlFreeDoc(doc_00);
    return local_2c;
  }
  fprintf(_stderr,"%s is corrupted \n","xmlconf/xmlconf.xml");
  xmlconfInfo();
  return -1;
}

Assistant:

static int
xmlconfTest(void) {
    const char *confxml = "xmlconf/xmlconf.xml";
    xmlDocPtr doc;
    xmlNodePtr cur;
    int ret = 0;

    if (!checkTestFile(confxml)) {
        fprintf(stderr, "%s is missing \n", confxml);
	xmlconfInfo();
	return(-1);
    }
    doc = xmlReadFile(confxml, NULL, XML_PARSE_NOENT);
    if (doc == NULL) {
        fprintf(stderr, "%s is corrupted \n", confxml);
	xmlconfInfo();
	return(-1);
    }

    cur = xmlDocGetRootElement(doc);
    if ((cur == NULL) || (!xmlStrEqual(cur->name, BAD_CAST "TESTSUITE"))) {
        fprintf(stderr, "Unexpected format %s\n", confxml);
	xmlconfInfo();
	ret = -1;
    } else {
        ret = xmlconfTestSuite(doc, cur);
    }
    xmlFreeDoc(doc);
    return(ret);
}